

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.h
# Opt level: O0

void __thiscall adios2::core::Attribute<signed_char>::~Attribute(Attribute<signed_char> *this)

{
  undefined8 *in_RDI;
  vector<signed_char,_std::allocator<signed_char>_> *unaff_retaddr;
  
  *in_RDI = &PTR__Attribute_0112aff0;
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector(unaff_retaddr);
  AttributeBase::~AttributeBase((AttributeBase *)0x82d834);
  return;
}

Assistant:

~Attribute() = default;